

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load(elfio *this,istream *stream)

{
  long lVar1;
  elf_header *peVar2;
  ulong uVar3;
  char *in_RSI;
  long in_RDI;
  bool is_still_good;
  uchar e_ident [16];
  istream *in_stack_00000088;
  elfio *in_stack_00000090;
  elfio *in_stack_00000098;
  char local_28;
  char local_27;
  char local_26;
  char local_25;
  char local_24;
  uchar in_stack_ffffffffffffffdf;
  endianess_convertor *in_stack_ffffffffffffffe0;
  undefined2 uVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar5;
  
  lVar1 = in_RDI;
  clean((elfio *)stream);
  uVar4 = (undefined2)((ulong)lVar1 >> 0x30);
  std::istream::read(in_RSI,(long)&local_28);
  lVar1 = std::istream::gcount();
  if ((((lVar1 == 0x10) && (local_28 == '\x7f')) && (local_27 == 'E')) &&
     ((local_26 == 'L' && (local_25 == 'F')))) {
    if ((local_24 == '\x02') || (local_24 == '\x01')) {
      endianess_convertor::setup(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
      peVar2 = create_header((elfio *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             (uchar)((ushort)uVar4 >> 8),(uchar)uVar4);
      *(elf_header **)(in_RDI + 0x10) = peVar2;
      if (*(long *)(in_RDI + 0x10) == 0) {
        bVar5 = false;
      }
      else {
        uVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),in_RSI);
        if ((uVar3 & 1) == 0) {
          bVar5 = false;
        }
        else {
          load_sections(in_stack_00000090,in_stack_00000088);
          bVar5 = load_segments(in_stack_00000098,(istream *)in_stack_00000090);
        }
      }
    }
    else {
      bVar5 = false;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool load( std::istream &stream )
    {
        clean();

	unsigned char e_ident[EI_NIDENT];
	// Read ELF file signature
	stream.read( reinterpret_cast<char*>( &e_ident ), sizeof( e_ident ) );

        // Is it ELF file?
        if ( stream.gcount() != sizeof( e_ident ) ||
             e_ident[EI_MAG0] != ELFMAG0    ||
             e_ident[EI_MAG1] != ELFMAG1    ||
             e_ident[EI_MAG2] != ELFMAG2    ||
             e_ident[EI_MAG3] != ELFMAG3 ) {
            return false;
        }

        if ( ( e_ident[EI_CLASS] != ELFCLASS64 ) &&
             ( e_ident[EI_CLASS] != ELFCLASS32 )) {
            return false;
        }

        convertor.setup( e_ident[EI_DATA] );
        header = create_header( e_ident[EI_CLASS], e_ident[EI_DATA] );
        if ( 0 == header ) {
            return false;
        }
        if ( !header->load( stream ) ) {
            return false;
        }

        load_sections( stream );
        bool is_still_good = load_segments( stream );
        return is_still_good;
    }